

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_9,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  float *pfVar6;
  long lVar7;
  undefined8 *puVar8;
  int col_1;
  long lVar9;
  int col;
  undefined4 uVar10;
  Matrix<float,_3,_3> retVal;
  Vec4 *local_b0;
  ulong local_a8;
  float local_a0 [6];
  undefined8 uStack_88;
  float fStack_80;
  undefined4 uStack_7c;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Type in1;
  float local_28 [10];
  
  pfVar3 = res_1.m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar9) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar3 + lVar9) = uVar10;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
      lVar7 = lVar7 + 1;
      pfVar3 = pfVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    stack0xffffffffffffffa8 = *(undefined8 *)evalCtx->in[0].m_data;
  }
  else {
    stack0xffffffffffffffa8 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar4 = 0;
    do {
      lVar7 = 0;
      pfVar6 = pfVar3;
      do {
        *pfVar6 = (float)puVar5[lVar7];
        lVar7 = lVar7 + 1;
        pfVar6 = pfVar6 + 3;
      } while (lVar7 != 3);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      puVar5 = puVar5 + 3;
    } while (lVar4 != 3);
  }
  puVar2 = &uStack_88;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      lVar9 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar9) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar9) = uVar10;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x24);
      lVar7 = lVar7 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar7 != 3);
    uStack_88 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_80 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_7c = (undefined4)uVar1;
    res.m_data[0] = (float)((ulong)uVar1 >> 0x20);
    res.m_data[1] = evalCtx->in[1].m_data[2];
    stack0xffffffffffffff90 = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    res.m_data[0] = 0.0;
    res.m_data[1] = 0.0;
    stack0xffffffffffffff90 = 0;
    uStack_88 = 0;
    fStack_80 = 0.0;
    uStack_7c = 0;
    puVar5 = &DAT_00b1d484;
    lVar4 = 0;
    do {
      lVar7 = 0;
      puVar8 = puVar2;
      do {
        *(undefined4 *)puVar8 = puVar5[lVar7];
        lVar7 = lVar7 + 1;
        puVar8 = (undefined8 *)((long)puVar8 + 0xc);
      } while (lVar7 != 3);
      lVar4 = lVar4 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 3);
  }
  pfVar3 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[8] = 0.0;
  lVar4 = 0;
  lVar7 = 0;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar4 != lVar9) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar3 + lVar9) = uVar10;
      lVar9 = lVar9 + 0xc;
    } while (lVar9 != 0x24);
    lVar7 = lVar7 + 1;
    pfVar3 = pfVar3 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar7 != 3);
  pfVar3 = local_28;
  puVar2 = &uStack_88;
  pfVar6 = res_1.m_data + 2;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)pfVar3 + lVar7) =
           *(float *)((long)pfVar6 + lVar7) * *(float *)((long)puVar2 + lVar7);
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 1;
    puVar2 = (undefined8 *)((long)puVar2 + 4);
    pfVar6 = pfVar6 + 1;
  } while (lVar4 != 3);
  local_a8 = local_a8 & 0xffffffff00000000;
  local_b0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_b0 + lVar4 * 4) = local_28[lVar4] + local_28[lVar4 + 3];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4 + 2] = *(float *)((long)&local_b0 + lVar4 * 4) + local_28[lVar4 + 6];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar4 * 4)] = local_a0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}